

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_range_count(nk_rune *range)

{
  int *piVar1;
  ulong uVar2;
  nk_rune *iter;
  
  if (range != (nk_rune *)0x0) {
    uVar2 = 0;
    do {
      piVar1 = (int *)((long)range + uVar2);
      uVar2 = uVar2 + 4;
    } while (*piVar1 != 0);
    return (int)((uVar2 >> 2) - ((long)uVar2 >> 0x3f) >> 1);
  }
  __assert_fail("range",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x314a,"int nk_range_count(const nk_rune *)");
}

Assistant:

NK_INTERN int
nk_range_count(const nk_rune *range)
{
    const nk_rune *iter = range;
    NK_ASSERT(range);
    if (!range) return 0;
    while (*(iter++) != 0);
    return (iter == range) ? 0 : (int)((iter - range)/2);
}